

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O3

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::AssertionInstanceExpression>
          (SampledValueFuncVisitor *this,AssertionInstanceExpression *expr)

{
  ConstantValue *pCVar1;
  bool bVar2;
  KnownSystemName KVar3;
  SourceLocation SVar4;
  Diagnostic *this_00;
  string_view arg;
  
  bVar2 = ClockInference::isSampledValueFuncCall(&expr->super_Expression);
  if (!bVar2) {
    ast::AssertionInstanceExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>
              (expr,this);
    return;
  }
  KVar3 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
  pCVar1 = expr[1].super_Expression.constant;
  if (KVar3 == Past) {
    if (pCVar1 != (ConstantValue *)0x4) goto LAB_00144230;
    SVar4 = ((expr[1].super_Expression.type.ptr)->super_Symbol).location;
  }
  else {
    if (pCVar1 != (ConstantValue *)0x2) goto LAB_00144230;
    SVar4 = (SourceLocation)((expr[1].super_Expression.type.ptr)->super_Symbol).name._M_len;
  }
  if (*(int *)SVar4 != 0x1e) {
    return;
  }
LAB_00144230:
  this_00 = AnalysisContext::addDiag
                      (this->context,this->parentSymbol,(DiagCode)0x8000e,
                       (expr->super_Expression).sourceRange);
  arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }